

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O0

BBox<2> * Omega_h::get_bounding_box<2>(BBox<2> *__return_storage_ptr__,Mesh *mesh)

{
  element_type *peVar1;
  double dVar2;
  BBox<2> *bb;
  undefined1 local_90 [32];
  int local_70;
  Int i;
  undefined1 local_60 [24];
  Mesh *mesh_local;
  Vector<2> *local_40;
  int local_34;
  Vector<2> *local_30;
  int local_24;
  BBox<2> *local_20;
  int local_14;
  BBox<2> *local_10;
  
  local_60._16_8_ = mesh;
  Mesh::coords((Mesh *)local_60);
  find_bounding_box<2>(__return_storage_ptr__,(Reals *)local_60);
  Read<double>::~Read((Read<double> *)local_60);
  for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
    Mesh::comm((Mesh *)(local_90 + 0x10));
    peVar1 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(local_90 + 0x10));
    local_14 = local_70;
    local_10 = __return_storage_ptr__;
    dVar2 = Comm::allreduce<double>
                      (peVar1,(__return_storage_ptr__->min).super_Few<double,_2>.array_[local_70],
                       OMEGA_H_MIN);
    local_24 = local_70;
    (__return_storage_ptr__->min).super_Few<double,_2>.array_[local_70] = dVar2;
    local_20 = __return_storage_ptr__;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)(local_90 + 0x10));
    Mesh::comm((Mesh *)local_90);
    peVar1 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    local_30 = &__return_storage_ptr__->max;
    local_34 = local_70;
    dVar2 = Comm::allreduce<double>
                      (peVar1,(local_30->super_Few<double,_2>).array_[local_70],OMEGA_H_MAX);
    local_40 = &__return_storage_ptr__->max;
    mesh_local._4_4_ = local_70;
    (local_40->super_Few<double,_2>).array_[local_70] = dVar2;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}